

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O1

void WebRtcAgc_SaturationCtrl(LegacyAgc *stt,uint8_t *saturated,int32_t *env)

{
  int16_t i;
  long lVar1;
  
  lVar1 = 0;
  do {
    if (0x36b < env[lVar1] >> 0x14) {
      stt->envSum = stt->envSum + (short)(env[lVar1] >> 0x14);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 10);
  if (25000 < stt->envSum) {
    *saturated = '\x01';
    stt->envSum = 0;
  }
  stt->envSum = (int16_t)((uint)(stt->envSum * 0x7eb8) >> 0xf);
  return;
}

Assistant:

void WebRtcAgc_SaturationCtrl(LegacyAgc *stt, uint8_t *saturated, const int32_t *env) {
    int16_t i, tmpW16;

    /* Check if the signal is saturated */
    for (i = 0; i < 10; i++) {
        tmpW16 = (int16_t) (env[i] >> 20);
        if (tmpW16 > 875) {
            stt->envSum += tmpW16;
        }
    }

    if (stt->envSum > 25000) {
        *saturated = 1;
        stt->envSum = 0;
    }

    /* stt->envSum *= 0.99; */
    stt->envSum = (int16_t) ((stt->envSum * 32440) >> 15);
}